

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

void __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::save
          (section_impl<ELFIO::Elf32_Shdr> *this,ostream *f,streampos header_offset,
          streampos data_offset)

{
  streampos header_offset_00;
  streampos data_offset_00;
  short sVar1;
  uint32_t uVar2;
  int iVar3;
  streamoff sVar4;
  long lVar5;
  ostream *in_RCX;
  section_impl<ELFIO::Elf32_Shdr> *in_RDX;
  __mbstate_t in_RSI;
  long *in_RDI;
  __mbstate_t in_R8;
  ostream *in_stack_ffffffffffffffb8;
  long *plVar6;
  
  plVar6 = in_RDI;
  sVar1 = (**(code **)(*in_RDI + 0x10))();
  if (sVar1 != 0) {
    sVar4 = std::fpos::operator_cast_to_long((fpos *)&stack0xffffffffffffffe0);
    *(int *)(in_RDI + 4) = (int)sVar4;
    uVar2 = endianess_convertor::operator()
                      ((endianess_convertor *)in_RDI[0xe],*(uint32_t *)(in_RDI + 4));
    *(uint32_t *)(in_RDI + 4) = uVar2;
  }
  header_offset_00._M_state = in_RSI;
  header_offset_00._M_off = (streamoff)in_RCX;
  save_header(in_RDX,in_stack_ffffffffffffffb8,header_offset_00);
  iVar3 = (**(code **)(*in_RDI + 0x28))();
  if (iVar3 != 8) {
    iVar3 = (**(code **)(*in_RDI + 0x28))();
    if (iVar3 != 0) {
      lVar5 = (**(code **)(*in_RDI + 0x98))();
      if ((lVar5 != 0) && (in_RDI[0xc] != 0)) {
        data_offset_00._M_state = in_R8;
        data_offset_00._M_off = (streamoff)plVar6;
        save_data((section_impl<ELFIO::Elf32_Shdr> *)in_RSI,in_RCX,data_offset_00);
      }
    }
  }
  return;
}

Assistant:

void
    save( std::ostream&  f,
          std::streampos header_offset,
          std::streampos data_offset )
    {
        if ( 0 != get_index() ) {
            header.sh_offset = data_offset;
            header.sh_offset = (*convertor)( header.sh_offset );
        }

        save_header( f, header_offset );
        if ( get_type() != SHT_NOBITS && get_type() != SHT_NULL &&
             get_size() != 0 && data != 0 ) {
            save_data( f, data_offset );
        }
    }